

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m_cheat.cpp
# Opt level: O0

void cht_Take(player_t *player,char *name,int amount)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  PClassActor **ppPVar4;
  AInventory *pAVar5;
  PClassActor *pPVar6;
  bool bVar7;
  uint local_dc;
  AActor *puzzlepiece;
  uint i_6;
  AActor *artifact;
  uint i_5;
  AActor *weapon;
  uint i_4;
  AActor *key;
  uint i_3;
  AInventory *armor;
  uint i_2;
  AInventory *ammo;
  PClass *type_2;
  uint i_1;
  AInventory *pack;
  PClass *type_1;
  uint i;
  PClassActor *type;
  bool takeall;
  int amount_local;
  char *name_local;
  player_t *player_local;
  
  if (player->mo == (APlayerPawn *)0x0) {
    return;
  }
  if (player->health < 1) {
    return;
  }
  iVar2 = strcasecmp(name,"all");
  bVar7 = iVar2 == 0;
  if ((!bVar7) && (iVar2 = strcasecmp(name,"health"), iVar2 == 0)) {
    if (((player->mo->super_AActor).health - amount < 1) ||
       ((player->health - amount < 1 || (amount == 0)))) {
      cht_Suicide(player);
      if (player != (player_t *)(&players + (long)consoleplayer * 0x54)) {
        return;
      }
      C_HideConsole();
      return;
    }
    if (0 < amount) {
      if (player->mo == (APlayerPawn *)0x0) {
        player->health = player->health - amount;
      }
      else {
        (player->mo->super_AActor).health = (player->mo->super_AActor).health - amount;
        player->health = (player->mo->super_AActor).health;
      }
    }
    if (!bVar7) {
      return;
    }
  }
  if ((bVar7) || (iVar2 = strcasecmp(name,"backpack"), iVar2 == 0)) {
    for (type_1._4_4_ = 0;
        uVar3 = TArray<PClassActor_*,_PClassActor_*>::Size(&PClassActor::AllActorClasses),
        type_1._4_4_ < uVar3; type_1._4_4_ = type_1._4_4_ + 1) {
      ppPVar4 = TArray<PClassActor_*,_PClassActor_*>::operator[]
                          (&PClassActor::AllActorClasses,(ulong)type_1._4_4_);
      pPVar6 = *ppPVar4;
      bVar1 = PClass::IsDescendantOf(&pPVar6->super_PClass,ABackpackItem::RegistrationInfo.MyClass);
      if ((bVar1) &&
         (pAVar5 = AActor::FindInventory(&player->mo->super_AActor,pPVar6,false),
         pAVar5 != (AInventory *)0x0)) {
        (*(pAVar5->super_AActor).super_DThinker.super_DObject._vptr_DObject[4])();
      }
    }
    if (!bVar7) {
      return;
    }
  }
  if ((bVar7) || (iVar2 = strcasecmp(name,"ammo"), iVar2 == 0)) {
    for (type_2._4_4_ = 0;
        uVar3 = TArray<PClassActor_*,_PClassActor_*>::Size(&PClassActor::AllActorClasses),
        type_2._4_4_ < uVar3; type_2._4_4_ = type_2._4_4_ + 1) {
      ppPVar4 = TArray<PClassActor_*,_PClassActor_*>::operator[]
                          (&PClassActor::AllActorClasses,(ulong)type_2._4_4_);
      if ((((*ppPVar4)->super_PClass).ParentClass == AAmmo::RegistrationInfo.MyClass) &&
         (pAVar5 = AActor::FindInventory(&player->mo->super_AActor,*ppPVar4,false),
         pAVar5 != (AInventory *)0x0)) {
        (*(pAVar5->super_AActor).super_DThinker.super_DObject._vptr_DObject[0x1a])();
      }
    }
    if (!bVar7) {
      return;
    }
  }
  if ((bVar7) || (iVar2 = strcasecmp(name,"armor"), iVar2 == 0)) {
    for (armor._4_4_ = 0;
        uVar3 = TArray<PClassActor_*,_PClassActor_*>::Size(&PClassActor::AllActorClasses),
        armor._4_4_ < uVar3; armor._4_4_ = armor._4_4_ + 1) {
      ppPVar4 = TArray<PClassActor_*,_PClassActor_*>::operator[]
                          (&PClassActor::AllActorClasses,(ulong)armor._4_4_);
      pPVar6 = *ppPVar4;
      bVar1 = PClass::IsDescendantOf(&pPVar6->super_PClass,AArmor::RegistrationInfo.MyClass);
      if ((bVar1) &&
         (pAVar5 = AActor::FindInventory(&player->mo->super_AActor,pPVar6,false),
         pAVar5 != (AInventory *)0x0)) {
        (*(pAVar5->super_AActor).super_DThinker.super_DObject._vptr_DObject[0x1a])();
      }
    }
    if (!bVar7) {
      return;
    }
  }
  if ((bVar7) || (iVar2 = strcasecmp(name,"keys"), iVar2 == 0)) {
    for (key._4_4_ = 0;
        uVar3 = TArray<PClassActor_*,_PClassActor_*>::Size(&PClassActor::AllActorClasses),
        key._4_4_ < uVar3; key._4_4_ = key._4_4_ + 1) {
      ppPVar4 = TArray<PClassActor_*,_PClassActor_*>::operator[]
                          (&PClassActor::AllActorClasses,(ulong)key._4_4_);
      pPVar6 = *ppPVar4;
      bVar1 = PClass::IsDescendantOf(&pPVar6->super_PClass,AKey::RegistrationInfo.MyClass);
      if ((bVar1) &&
         (pAVar5 = AActor::FindInventory(&player->mo->super_AActor,pPVar6,false),
         pAVar5 != (AInventory *)0x0)) {
        (*(pAVar5->super_AActor).super_DThinker.super_DObject._vptr_DObject[4])();
      }
    }
    if (!bVar7) {
      return;
    }
  }
  if ((bVar7) || (iVar2 = strcasecmp(name,"weapons"), iVar2 == 0)) {
    for (weapon._4_4_ = 0;
        uVar3 = TArray<PClassActor_*,_PClassActor_*>::Size(&PClassActor::AllActorClasses),
        weapon._4_4_ < uVar3; weapon._4_4_ = weapon._4_4_ + 1) {
      ppPVar4 = TArray<PClassActor_*,_PClassActor_*>::operator[]
                          (&PClassActor::AllActorClasses,(ulong)weapon._4_4_);
      pPVar6 = *ppPVar4;
      if ((pPVar6 != (PClassActor *)AWeapon::RegistrationInfo.MyClass) &&
         (bVar1 = PClass::IsDescendantOf(&pPVar6->super_PClass,AWeapon::RegistrationInfo.MyClass),
         bVar1)) {
        pAVar5 = AActor::FindInventory(&player->mo->super_AActor,pPVar6,false);
        if (pAVar5 != (AInventory *)0x0) {
          (*(pAVar5->super_AActor).super_DThinker.super_DObject._vptr_DObject[4])();
        }
        player->ReadyWeapon = (AWeapon *)0x0;
        player->PendingWeapon = (AWeapon *)AWeapon::RegistrationInfo.MyClass;
      }
    }
    if (!bVar7) {
      return;
    }
  }
  if ((bVar7) || (iVar2 = strcasecmp(name,"artifacts"), iVar2 == 0)) {
    for (artifact._4_4_ = 0;
        uVar3 = TArray<PClassActor_*,_PClassActor_*>::Size(&PClassActor::AllActorClasses),
        artifact._4_4_ < uVar3; artifact._4_4_ = artifact._4_4_ + 1) {
      ppPVar4 = TArray<PClassActor_*,_PClassActor_*>::operator[]
                          (&PClassActor::AllActorClasses,(ulong)artifact._4_4_);
      pPVar6 = *ppPVar4;
      bVar1 = PClass::IsDescendantOf(&pPVar6->super_PClass,AInventory::RegistrationInfo.MyClass);
      if (((((bVar1) &&
            (bVar1 = PClass::IsDescendantOf
                               (&pPVar6->super_PClass,APuzzleItem::RegistrationInfo.MyClass), !bVar1
            )) && (bVar1 = PClass::IsDescendantOf
                                     (&pPVar6->super_PClass,APowerup::RegistrationInfo.MyClass),
                  !bVar1)) &&
          ((bVar1 = PClass::IsDescendantOf(&pPVar6->super_PClass,AArmor::RegistrationInfo.MyClass),
           !bVar1 && (bVar1 = PClass::IsDescendantOf
                                        (&pPVar6->super_PClass,AWeapon::RegistrationInfo.MyClass),
                     !bVar1)))) &&
         ((bVar1 = PClass::IsDescendantOf(&pPVar6->super_PClass,AKey::RegistrationInfo.MyClass),
          !bVar1 && (pAVar5 = AActor::FindInventory(&player->mo->super_AActor,pPVar6,false),
                    pAVar5 != (AInventory *)0x0)))) {
        (*(pAVar5->super_AActor).super_DThinker.super_DObject._vptr_DObject[4])();
      }
    }
    if (!bVar7) {
      return;
    }
  }
  if ((bVar7) || (iVar2 = strcasecmp(name,"puzzlepieces"), iVar2 == 0)) {
    for (puzzlepiece._4_4_ = 0;
        uVar3 = TArray<PClassActor_*,_PClassActor_*>::Size(&PClassActor::AllActorClasses),
        puzzlepiece._4_4_ < uVar3; puzzlepiece._4_4_ = puzzlepiece._4_4_ + 1) {
      ppPVar4 = TArray<PClassActor_*,_PClassActor_*>::operator[]
                          (&PClassActor::AllActorClasses,(ulong)puzzlepiece._4_4_);
      pPVar6 = *ppPVar4;
      bVar1 = PClass::IsDescendantOf(&pPVar6->super_PClass,APuzzleItem::RegistrationInfo.MyClass);
      if ((bVar1) &&
         (pAVar5 = AActor::FindInventory(&player->mo->super_AActor,pPVar6,false),
         pAVar5 != (AInventory *)0x0)) {
        (*(pAVar5->super_AActor).super_DThinker.super_DObject._vptr_DObject[4])();
      }
    }
    if (!bVar7) {
      return;
    }
  }
  if (!bVar7) {
    pPVar6 = PClass::FindActor(name);
    if ((pPVar6 == (PClassActor *)0x0) ||
       (bVar7 = PClass::IsDescendantOf(&pPVar6->super_PClass,AInventory::RegistrationInfo.MyClass),
       !bVar7)) {
      if (player == (player_t *)(&players + (long)consoleplayer * 0x54)) {
        Printf("Unknown item \"%s\"\n",name);
      }
    }
    else {
      local_dc = amount;
      if (amount == 0) {
        local_dc = 1;
      }
      (*(player->mo->super_AActor).super_DThinker.super_DObject._vptr_DObject[0x16])
                (player->mo,pPVar6,(ulong)local_dc,0);
    }
  }
  return;
}

Assistant:

void cht_Take (player_t *player, const char *name, int amount)
{
	bool takeall;
	PClassActor *type;

	if (player->mo == NULL || player->health <= 0)
	{
		return;
	}

	takeall = (stricmp (name, "all") == 0);

	if (!takeall && stricmp (name, "health") == 0)
	{
		if (player->mo->health - amount <= 0
			|| player->health - amount <= 0
			|| amount == 0)
		{

			cht_Suicide (player);

			if (player == &players[consoleplayer])
				C_HideConsole ();

			return;
		}

		if (amount > 0)
		{
			if (player->mo)
			{
				player->mo->health -= amount;
	  			player->health = player->mo->health;
			}
			else
			{
				player->health -= amount;
			}
		}

		if (!takeall)
			return;
	}

	if (takeall || stricmp (name, "backpack") == 0)
	{
		// Take away all types of backpacks the player might own.
		for (unsigned int i = 0; i < PClassActor::AllActorClasses.Size(); ++i)
		{
			PClass *type = PClassActor::AllActorClasses[i];

			if (type->IsDescendantOf(RUNTIME_CLASS (ABackpackItem)))
			{
				AInventory *pack = player->mo->FindInventory(static_cast<PClassActor *>(type));

				if (pack)
					pack->Destroy();
			}
		}

		if (!takeall)
			return;
	}

	if (takeall || stricmp (name, "ammo") == 0)
	{
		for (unsigned int i = 0; i < PClassActor::AllActorClasses.Size(); ++i)
		{
			PClass *type = PClassActor::AllActorClasses[i];

			if (type->ParentClass == RUNTIME_CLASS (AAmmo))
			{
				AInventory *ammo = player->mo->FindInventory(static_cast<PClassActor *>(type));

				if (ammo)
					ammo->DepleteOrDestroy();
			}
		}

		if (!takeall)
			return;
	}

	if (takeall || stricmp (name, "armor") == 0)
	{
		for (unsigned int i = 0; i < PClassActor::AllActorClasses.Size(); ++i)
		{
			type = PClassActor::AllActorClasses[i];

			if (type->IsDescendantOf (RUNTIME_CLASS (AArmor)))
			{
				AInventory *armor = player->mo->FindInventory(static_cast<PClassActor *>(type));

				if (armor)
					armor->DepleteOrDestroy();
			}
		}

		if (!takeall)
			return;
	}

	if (takeall || stricmp (name, "keys") == 0)
	{
		for (unsigned int i = 0; i < PClassActor::AllActorClasses.Size(); ++i)
		{
			type = PClassActor::AllActorClasses[i];

			if (type->IsDescendantOf (RUNTIME_CLASS (AKey)))
			{
				AActor *key = player->mo->FindInventory(static_cast<PClassActor *>(type));

				if (key)
					key->Destroy ();
			}
		}

		if (!takeall)
			return;
	}

	if (takeall || stricmp (name, "weapons") == 0)
	{
		for (unsigned int i = 0; i < PClassActor::AllActorClasses.Size(); ++i)
		{
			type = PClassActor::AllActorClasses[i];

			if (type != RUNTIME_CLASS(AWeapon) &&
				type->IsDescendantOf (RUNTIME_CLASS (AWeapon)))
			{
				AActor *weapon = player->mo->FindInventory(static_cast<PClassActor *>(type));

				if (weapon)
					weapon->Destroy ();

				player->ReadyWeapon = nullptr;
				player->PendingWeapon = WP_NOCHANGE;
			}
		}

		if (!takeall)
			return;
	}

	if (takeall || stricmp (name, "artifacts") == 0)
	{
		for (unsigned int i = 0; i < PClassActor::AllActorClasses.Size(); ++i)
		{
			type = PClassActor::AllActorClasses[i];

			if (type->IsDescendantOf (RUNTIME_CLASS (AInventory)))
			{
				if (!type->IsDescendantOf (RUNTIME_CLASS (APuzzleItem)) &&
					!type->IsDescendantOf (RUNTIME_CLASS (APowerup)) &&
					!type->IsDescendantOf (RUNTIME_CLASS (AArmor)) &&
					!type->IsDescendantOf (RUNTIME_CLASS (AWeapon)) &&
					!type->IsDescendantOf (RUNTIME_CLASS (AKey)))
				{
					AActor *artifact = player->mo->FindInventory(static_cast<PClassActor *>(type));

					if (artifact)
						artifact->Destroy ();
				}
			}
		}

		if (!takeall)
			return;
	}

	if (takeall || stricmp (name, "puzzlepieces") == 0)
	{
		for (unsigned int i = 0; i < PClassActor::AllActorClasses.Size(); ++i)
		{
			type = PClassActor::AllActorClasses[i];

			if (type->IsDescendantOf (RUNTIME_CLASS (APuzzleItem)))
			{
				AActor *puzzlepiece = player->mo->FindInventory(static_cast<PClassActor *>(type));

				if (puzzlepiece)
					puzzlepiece->Destroy ();
			}
		}

		if (!takeall)
			return;
	}

	if (takeall)
		return;

	type = PClass::FindActor (name);
	if (type == NULL || !type->IsDescendantOf (RUNTIME_CLASS (AInventory)))
	{
		if (player == &players[consoleplayer])
			Printf ("Unknown item \"%s\"\n", name);
	}
	else
	{
		player->mo->TakeInventory(type, amount ? amount : 1);
	}
	return;
}